

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Send(void *buf,int count,MPIABI_Datatype datatype,int dest,int tag,MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Send();
  return iVar1;
}

Assistant:

int MPIABI_Send(
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int tag,
  MPIABI_Comm comm
) {
  return MPI_Send(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    tag,
    (MPI_Comm)(WPI_Comm)comm
  );
}